

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_get_multiset_Test::ObjectTest_basic_get_multiset_Test
          (ObjectTest_basic_get_multiset_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a17e8;
  return;
}

Assistant:

TEST(ObjectTest, basic_get_multiset) {
	object obj;

	EXPECT_TRUE(obj.get<std::multiset<bool>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<short>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<int>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long long>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<float>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<double>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long double>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<object>>().empty());
}